

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O1

void CSOAA::finish(ldf *data)

{
  action_score *__ptr;
  v_array<ACTION_SCORE::action_score> *__ptr_00;
  
  LabelDict::free_label_features(&data->label_features);
  __ptr = (data->a_s)._begin;
  if (__ptr != (action_score *)0x0) {
    free(__ptr);
  }
  (data->a_s)._begin = (action_score *)0x0;
  (data->a_s)._end = (action_score *)0x0;
  (data->a_s).end_array = (action_score *)0x0;
  __ptr_00 = (data->stored_preds)._begin;
  if (__ptr_00 != (v_array<ACTION_SCORE::action_score> *)0x0) {
    free(__ptr_00);
  }
  (data->stored_preds)._begin = (v_array<ACTION_SCORE::action_score> *)0x0;
  (data->stored_preds)._end = (v_array<ACTION_SCORE::action_score> *)0x0;
  (data->stored_preds).end_array = (v_array<ACTION_SCORE::action_score> *)0x0;
  return;
}

Assistant:

void finish(ldf& data)
{
  LabelDict::free_label_features(data.label_features);
  data.a_s.delete_v();
  data.stored_preds.delete_v();
}